

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateReplayer::Impl::parse_shader_modules
          (Impl *this,StateCreatorInterface *iface,Value *modules,uint8_t *varint,size_t varint_size
          )

{
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  VkShaderModuleCreateInfo *pVVar1;
  Hash HVar2;
  VkShaderModuleCreateInfo *pVVar3;
  bool bVar4;
  SizeType SVar5;
  uint uVar6;
  int iVar7;
  ConstMemberIterator this_01;
  ConstMemberIterator CVar8;
  Ch *pCVar9;
  size_type sVar10;
  Type pGVar11;
  uint64_t uVar12;
  uint32_t *words;
  uint64_t buffer_size;
  mapped_type *ppVVar13;
  char *__ptr;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkShaderModule_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModule_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_02;
  uint uVar14;
  long *in_FS_OFFSET;
  size_t sStack_80;
  Hash hash;
  uint local_6c;
  Impl *local_68;
  StateCreatorInterface *local_60;
  uint8_t *local_58;
  size_t local_50;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkShaderModule_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModule_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_48;
  Value *local_40;
  VkShaderModuleCreateInfo *local_38;
  
  local_60 = iface;
  local_58 = varint;
  local_50 = varint_size;
  SVar5 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::MemberCount(modules);
  local_38 = ScratchAllocator::allocate_n_cleared<VkShaderModuleCreateInfo>
                       (&this->allocator,(ulong)SVar5);
  this_01 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::MemberBegin(modules);
  this_02 = &(this->replayed_shader_modules)._M_h;
  uVar14 = 0;
  local_68 = this;
  local_48 = this_02;
  local_40 = modules;
  do {
    CVar8 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::MemberEnd(modules);
    if (this_01.ptr_ == CVar8.ptr_) {
      (*local_60->_vptr_StateCreatorInterface[0x11])();
LAB_0010a19a:
      return this_01.ptr_ == CVar8.ptr_;
    }
    pCVar9 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(&(this_01.ptr_)->name);
    hash = string_to_uint64(pCVar9);
    sVar10 = std::
             _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkShaderModule_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModule_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::count(this_02,&hash);
    pVVar3 = local_38;
    if (sVar10 == 0) {
      this_00 = &(this_01.ptr_)->value;
      pVVar1 = local_38 + uVar14;
      local_38[uVar14].sType = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
      local_6c = uVar14;
      pGVar11 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ::operator[]<char_const>
                          ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            *)this_00,"flags");
      uVar6 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetUint(pGVar11);
      pVVar3[uVar14].flags = uVar6;
      pGVar11 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ::operator[]<char_const>
                          ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            *)this_00,"codeSize");
      uVar12 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetUint64(pGVar11);
      pVVar3[uVar14].codeSize = uVar12;
      bVar4 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember(this_00,"varintOffset");
      if (bVar4) {
        bVar4 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::HasMember(this_00,"varintSize");
        if (!bVar4) goto LAB_0010a117;
        words = (uint32_t *)
                ScratchAllocator::allocate_raw(&local_68->allocator,pVVar1->codeSize,0x40);
        pGVar11 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator[]<char_const>
                            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              *)this_00,"varintOffset");
        uVar12 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetUint64(pGVar11);
        pGVar11 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator[]<char_const>
                            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              *)this_00,"varintSize");
        buffer_size = rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::GetUint64(pGVar11);
        if (local_50 < buffer_size + uVar12) {
          if (*(int *)(*in_FS_OFFSET + -0x18) < 3) {
            bVar4 = Internal::log_thread_callback
                              (LOG_ERROR,"Binary varint buffer overflows payload.\n");
            if (!bVar4) {
              __ptr = "Fossilize ERROR: Binary varint buffer overflows payload.\n";
              sStack_80 = 0x39;
LAB_0010a22b:
              fwrite(__ptr,sStack_80,1,_stderr);
            }
          }
          goto LAB_0010a19a;
        }
        bVar4 = decode_varint(words,pVVar1->codeSize >> 2,local_58 + uVar12,buffer_size);
        if (!bVar4) {
          if (*(int *)(*in_FS_OFFSET + -0x18) < 3) {
            bVar4 = Internal::log_thread_callback(LOG_ERROR,"Invalid varint format.\n");
            if (!bVar4) {
              __ptr = "Fossilize ERROR: Invalid varint format.\n";
              sStack_80 = 0x28;
              goto LAB_0010a22b;
            }
          }
          goto LAB_0010a19a;
        }
      }
      else {
LAB_0010a117:
        pGVar11 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator[]<char_const>
                            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              *)this_00,"code");
        pCVar9 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetString(pGVar11);
        words = (uint32_t *)decode_base64(&local_68->allocator,pCVar9,pVVar1->codeSize);
      }
      this_02 = local_48;
      HVar2 = hash;
      pVVar1->pCode = words;
      ppVVar13 = std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkShaderModule_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModule_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkShaderModule_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModule_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)local_48,&hash);
      iVar7 = (*local_60->_vptr_StateCreatorInterface[8])(local_60,HVar2,pVVar1,ppVVar13);
      modules = local_40;
      uVar14 = local_6c;
      if ((char)iVar7 == '\0') goto LAB_0010a19a;
    }
    this_01.ptr_ = this_01.ptr_ + 1;
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

bool StateReplayer::Impl::parse_shader_modules(StateCreatorInterface &iface, const Value &modules,
                                               const uint8_t *varint, size_t varint_size)
{
	auto *infos = allocator.allocate_n_cleared<VkShaderModuleCreateInfo>(modules.MemberCount());

	unsigned index = 0;
	for (auto itr = modules.MemberBegin(); itr != modules.MemberEnd(); ++itr, index++)
	{
		Hash hash = string_to_uint64(itr->name.GetString());
		if (replayed_shader_modules.count(hash))
			continue;

		auto &obj = itr->value;
		auto &info = infos[index];
		info.sType = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
		info.flags = obj["flags"].GetUint();
		info.codeSize = obj["codeSize"].GetUint64();

		if (obj.HasMember("varintOffset") && obj.HasMember("varintSize"))
		{
			uint32_t *decoded = static_cast<uint32_t *>(allocator.allocate_raw(info.codeSize, 64));
			auto offset = obj["varintOffset"].GetUint64();
			auto size = obj["varintSize"].GetUint64();
			if (offset + size > varint_size)
			{
				LOGE_LEVEL("Binary varint buffer overflows payload.\n");
				return false;
			}

			if (!decode_varint(decoded, info.codeSize / 4, varint + offset, size))
			{
				LOGE_LEVEL("Invalid varint format.\n");
				return false;
			}

			info.pCode = decoded;
		}
		else
			info.pCode = reinterpret_cast<uint32_t *>(decode_base64(allocator, obj["code"].GetString(), info.codeSize));

		if (!iface.enqueue_create_shader_module(hash, &info, &replayed_shader_modules[hash]))
			return false;
	}

	iface.notify_replayed_resources_for_type();
	return true;
}